

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O0

ErrorData * __thiscall
duckdb::TableBinding::ColumnNotFoundError(TableBinding *this,string *column_name)

{
  string *psVar1;
  string *in_RDX;
  ErrorData *in_RDI;
  string candidate_message;
  allocator *n;
  string *in_stack_fffffffffffffee8;
  BindingAlias *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  ExceptionType in_stack_fffffffffffffeff;
  ErrorData *in_stack_ffffffffffffff00;
  string local_f8 [32];
  string local_d8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  string local_38 [32];
  string *local_18;
  
  n = &local_59;
  local_18 = in_RDX;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_58,"Candidate bindings: ",n);
  StringUtil::CandidatesErrorMessage
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
             &in_stack_fffffffffffffef0->catalog,in_stack_fffffffffffffee8,(idx_t)n);
  ::std::__cxx11::string::~string(local_58);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff50,
             "Table \"%s\" does not have a column named \"%s\"\n%s",
             (allocator *)&stack0xffffffffffffff4f);
  psVar1 = BindingAlias::GetAlias_abi_cxx11_(in_stack_fffffffffffffef0);
  ::std::__cxx11::string::string(local_d8,(string *)psVar1);
  ::std::__cxx11::string::string(local_f8,local_18);
  ::std::__cxx11::string::string((string *)&stack0xfffffffffffffee8,local_38);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff40);
  ErrorData::ErrorData
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffeff,&in_stack_fffffffffffffef0->catalog
            );
  ::std::__cxx11::string::~string(local_90);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
  ::std::__cxx11::string::~string(local_f8);
  ::std::__cxx11::string::~string(local_d8);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
  ::std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

ErrorData TableBinding::ColumnNotFoundError(const string &column_name) const {
	auto candidate_message = StringUtil::CandidatesErrorMessage(names, column_name, "Candidate bindings: ");
	return ErrorData(ExceptionType::BINDER, StringUtil::Format("Table \"%s\" does not have a column named \"%s\"\n%s",
	                                                           alias.GetAlias(), column_name, candidate_message));
}